

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool IsMemoryStoreToVariable(VmInstruction *instruction,VariableData *variable)

{
  VmValue *pVVar1;
  
  if ((instruction->cmd - VM_INST_STORE_BYTE < 7) || (instruction->cmd == VM_INST_MEM_COPY)) {
    if ((instruction->arguments).count == 0) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    pVVar1 = *(instruction->arguments).data;
    if ((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 1)) {
      return (VariableData *)pVVar1[1].comment.end == variable;
    }
  }
  return false;
}

Assistant:

bool IsMemoryStoreToVariable(VmInstruction *instruction, VariableData *variable)
{
	if(instruction->cmd >= VM_INST_STORE_BYTE && instruction->cmd <= VM_INST_STORE_STRUCT)
	{
		if(VmConstant *constant = getType<VmConstant>(instruction->arguments[0]))
			return constant->container == variable;
	}

	if(instruction->cmd == VM_INST_MEM_COPY)
	{
		if(VmConstant *constant = getType<VmConstant>(instruction->arguments[0]))
			return constant->container == variable;
	}

	return false;
}